

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O2

Status __thiscall
flatbuffers::anon_unknown_0::FBSCodeGenerator::GenerateCode
          (FBSCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  bool bVar1;
  Status SVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string fbs;
  
  bVar1 = this->no_log_;
  GenerateFBS(&fbs,parser,filename,bVar1);
  if (fbs._M_string_length == 0) {
    SVar2 = ERROR;
  }
  else {
    if (bVar1 == false) {
      fwrite("When you use --proto, that you should check for conformity yourself, using the existing --conform"
             ,0x61,1,_stderr);
    }
    std::operator+(&local_80,path,filename);
    std::operator+(&local_60,&local_80,".fbs");
    bVar1 = SaveFile(local_60._M_dataplus._M_p,&fbs,false);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    SVar2 = (Status)!bVar1;
  }
  std::__cxx11::string::~string((string *)&fbs);
  return SVar2;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateFBS(parser, path, filename, no_log_)) { return Status::ERROR; }
    return Status::OK;
  }